

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CLI::detail::split_up(string *str,char delimiter)

{
  bool bVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string value;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  it;
  size_t end;
  size_type bracketLoc;
  anon_class_1_1_06a9eca7_for__M_pred find_ws;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *output;
  undefined7 in_stack_fffffffffffffe98;
  char in_stack_fffffffffffffe9f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  value_type *in_stack_fffffffffffffea8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffeb0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffec8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  value_type local_d1;
  char in_stack_ffffffffffffff4f;
  size_t in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  
  __str = in_RDI;
  trim((string *)0x1cc7ad);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1cc7bf);
  while (bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1cc7c9
                      ), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
              (in_stack_fffffffffffffea0,
               CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_of(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9f,0x1cc7f5);
    if (sVar2 == 0xffffffffffffffff) {
      ::std::begin<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
      ::std::end<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
      _Var5 = ::std::
              find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::split_up(std::__cxx11::string,char)::_lambda(char)_1_>
                        (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                         (anon_class_1_1_06a9eca7_for__M_pred)
                         (char)((ulong)in_stack_fffffffffffffea8 >> 0x38));
      in_stack_fffffffffffffeb0 = _Var5;
      ::std::end<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
      bVar1 = __gnu_cxx::
              operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffea0,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffeb0._M_current,in_stack_fffffffffffffea8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1ccbc7);
      }
      else {
        local_d1._9_8_ =
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
        in_stack_fffffffffffffea8 = &local_d1;
        local_d1._1_8_ = _Var5;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::
        string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                  (in_stack_fffffffffffffec0,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                   (allocator<char> *)in_stack_fffffffffffffeb8._M_current);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffeb0._M_current,in_stack_fffffffffffffea8);
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffea8,(difference_type)in_stack_fffffffffffffea0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                  (in_stack_fffffffffffffea8);
        in_stack_fffffffffffffea0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffef7;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::
        string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                  (in_stack_fffffffffffffec0,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                   (allocator<char> *)in_stack_fffffffffffffeb8._M_current);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (in_stack_fffffffffffffef0,__str);
        ::std::__cxx11::string::~string(in_stack_fffffffffffffea0);
        ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffef7);
        ::std::__cxx11::string::~string(in_stack_fffffffffffffea0);
      }
    }
    else {
      in_stack_fffffffffffffec8._M_current = (char *)0x0;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                (in_stack_fffffffffffffea0,
                 CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9f,0x1cc826);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                (in_stack_fffffffffffffea0,
                 CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               close_sequence(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                              in_stack_ffffffffffffff4f);
      in_stack_fffffffffffffec0 = pbVar3;
      in_stack_fffffffffffffed0._M_current = (char *)pbVar3;
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                         (in_RSI);
      if (in_stack_fffffffffffffec0 < pbVar4) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffeb8._M_current,
                   (size_type)in_stack_fffffffffffffeb0._M_current,
                   (size_type)in_stack_fffffffffffffea8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffea0,
                    (value_type *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
        ::std::__cxx11::string::~string(in_stack_fffffffffffffea0);
        in_stack_fffffffffffffeb8._M_current = (char *)((long)&(pbVar3->_M_dataplus)._M_p + 2);
        pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 size(in_RSI);
        if (in_stack_fffffffffffffeb8._M_current < pbVar3) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffeb8._M_current,
                     (size_type)in_stack_fffffffffffffeb0._M_current,
                     (size_type)in_stack_fffffffffffffea8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (in_stack_fffffffffffffef0,__str);
          ::std::__cxx11::string::~string(in_stack_fffffffffffffea0);
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1cc9a9);
        }
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffea0,
                    (value_type *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1cc8a7);
      }
    }
    trim((string *)0x1ccbd3);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

CLI11_INLINE std::vector<std::string> split_up(std::string str, char delimiter) {

    auto find_ws = [delimiter](char ch) {
        return (delimiter == '\0') ? std::isspace<char>(ch, std::locale()) : (ch == delimiter);
    };
    trim(str);

    std::vector<std::string> output;
    while(!str.empty()) {
        if(bracketChars.find_first_of(str[0]) != std::string::npos) {
            auto bracketLoc = bracketChars.find_first_of(str[0]);
            auto end = close_sequence(str, 0, matchBracketChars[bracketLoc]);
            if(end >= str.size()) {
                output.push_back(std::move(str));
                str.clear();
            } else {
                output.push_back(str.substr(0, end + 1));
                if(end + 2 < str.size()) {
                    str = str.substr(end + 2);
                } else {
                    str.clear();
                }
            }

        } else {
            auto it = std::find_if(std::begin(str), std::end(str), find_ws);
            if(it != std::end(str)) {
                std::string value = std::string(str.begin(), it);
                output.push_back(value);
                str = std::string(it + 1, str.end());
            } else {
                output.push_back(str);
                str.clear();
            }
        }
        trim(str);
    }
    return output;
}